

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob_json.cc
# Opt level: O0

void __thiscall anon_unknown.dwarf_311d3c::Handlers::beginUnderOverlay(Handlers *this,JSON *j)

{
  undefined8 key;
  bool bVar1;
  element_type *this_00;
  allocator<char> local_a1;
  string local_a0;
  allocator<char> local_69;
  string local_68 [32];
  JSON local_48;
  undefined1 local_38 [8];
  string file;
  JSON *j_local;
  Handlers *this_local;
  
  file.field_2._8_8_ = j;
  std::__cxx11::string::string((string *)local_38);
  key = file.field_2._8_8_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_68,"file",&local_69);
  JSON::getDictItem(&local_48,(string *)key);
  bVar1 = JSON::getString(&local_48,(string *)local_38);
  JSON::~JSON(&local_48);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator(&local_69);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    QTC::TC("qpdf","QPDFJob json over/under no file",0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a0,"file is required in underlay/overlay specification",&local_a1);
    usage(this,&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
    std::allocator<char>::~allocator(&local_a1);
  }
  this_00 = std::__shared_ptr_access<QPDFJob::UOConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<QPDFJob::UOConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)&this->c_uo);
  QPDFJob::UOConfig::file(this_00,(string *)local_38);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void
Handlers::beginUnderOverlay(JSON const& j)
{
    // File has to be processed before items, so handle it here.
    std::string file;
    if (!j.getDictItem("file").getString(file)) {
        QTC::TC("qpdf", "QPDFJob json over/under no file");
        usage("file is required in underlay/overlay specification");
    }
    c_uo->file(file);
}